

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ql_nodeproj.cc
# Opt level: O0

RC __thiscall QL_NodeProj::DeleteNodes(QL_NodeProj *this)

{
  QL_Node *this_00;
  QL_NodeProj *this_local;
  
  (*this->prevNode->_vptr_QL_Node[4])();
  this_00 = this->prevNode;
  if (this_00 != (QL_Node *)0x0) {
    QL_Node::~QL_Node(this_00);
    operator_delete(this_00);
  }
  if (((this->super_QL_Node).listsInitialized & 1U) == 1) {
    free((this->super_QL_Node).attrsInRec);
    free(this->buffer);
  }
  (this->super_QL_Node).listsInitialized = false;
  return 0;
}

Assistant:

RC QL_NodeProj::DeleteNodes(){
  prevNode.DeleteNodes();
  delete &prevNode;
  if(listsInitialized == true){
    free(attrsInRec);
    free(buffer);
    //free(attrsToKeep);
  }
  listsInitialized = false;
  return (0);
}